

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int cvRcheck3(CVodeMem cv_mem)

{
  double dVar1;
  int iVar2;
  long in_RDI;
  int retval;
  int ier;
  int i;
  sunrealtype in_stack_00000020;
  void *in_stack_00000028;
  CVodeMem in_stack_00000038;
  int local_14;
  int local_4;
  
  if (*(int *)(in_RDI + 0x5c0) == 2) {
    *(undefined8 *)(in_RDI + 0x588) = *(undefined8 *)(in_RDI + 0x168);
    N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x60),*(undefined8 *)(in_RDI + 0xd0));
  }
  if (*(int *)(in_RDI + 0x5c0) == 1) {
    if ((*(double *)(in_RDI + 0x5b0) - *(double *)(in_RDI + 0x168)) * *(double *)(in_RDI + 0x140) <
        0.0) {
      *(undefined8 *)(in_RDI + 0x588) = *(undefined8 *)(in_RDI + 0x5b0);
      CVodeGetDky(in_stack_00000028,in_stack_00000020,cv_mem._4_4_,_ier);
    }
    else {
      *(undefined8 *)(in_RDI + 0x588) = *(undefined8 *)(in_RDI + 0x168);
      N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x60),*(undefined8 *)(in_RDI + 0xd0));
    }
  }
  iVar2 = (**(code **)(in_RDI + 0x560))
                    (*(undefined8 *)(in_RDI + 0x588),*(undefined8 *)(in_RDI + 0xd0),
                     *(undefined8 *)(in_RDI + 0x5a0),*(undefined8 *)(in_RDI + 0x18));
  *(long *)(in_RDI + 0x5c8) = *(long *)(in_RDI + 0x5c8) + 1;
  if (iVar2 == 0) {
    *(double *)(in_RDI + 0x5b8) =
         (ABS(*(double *)(in_RDI + 0x168)) + ABS(*(double *)(in_RDI + 0x140))) *
         *(double *)(in_RDI + 8) * 100.0;
    iVar2 = cvRootfind(in_stack_00000038);
    if (iVar2 == -0xc) {
      local_4 = -0xc;
    }
    else {
      for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x568); local_14 = local_14 + 1) {
        if ((*(int *)(*(long *)(in_RDI + 0x5d0) + (long)local_14 * 4) == 0) &&
           ((dVar1 = *(double *)(*(long *)(in_RDI + 0x5a8) + (long)local_14 * 8), dVar1 != 0.0 ||
            (NAN(dVar1))))) {
          *(undefined4 *)(*(long *)(in_RDI + 0x5d0) + (long)local_14 * 4) = 1;
        }
      }
      *(undefined8 *)(in_RDI + 0x580) = *(undefined8 *)(in_RDI + 0x590);
      for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x568); local_14 = local_14 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x598) + (long)local_14 * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 0x5a8) + (long)local_14 * 8);
      }
      if (iVar2 == 0) {
        local_4 = 0;
      }
      else {
        CVodeGetDky(in_stack_00000028,in_stack_00000020,cv_mem._4_4_,_ier);
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = -0xc;
  }
  return local_4;
}

Assistant:

static int cvRcheck3(CVodeMem cv_mem)
{
  int i, ier, retval;

  /* Set thi = tn or tout, whichever comes first; set y = y(thi). */
  if (cv_mem->cv_taskc == CV_ONE_STEP)
  {
    cv_mem->cv_thi = cv_mem->cv_tn;
    N_VScale(ONE, cv_mem->cv_zn[0], cv_mem->cv_y);
  }
  if (cv_mem->cv_taskc == CV_NORMAL)
  {
    if ((cv_mem->cv_toutc - cv_mem->cv_tn) * cv_mem->cv_h >= ZERO)
    {
      cv_mem->cv_thi = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], cv_mem->cv_y);
    }
    else
    {
      cv_mem->cv_thi = cv_mem->cv_toutc;
      (void)CVodeGetDky(cv_mem, cv_mem->cv_thi, 0, cv_mem->cv_y);
    }
  }

  /* Set ghi = g(thi) and call cvRootfind to search (tlo,thi) for roots. */
  retval = cv_mem->cv_gfun(cv_mem->cv_thi, cv_mem->cv_y, cv_mem->cv_ghi,
                           cv_mem->cv_user_data);
  cv_mem->cv_nge++;
  if (retval != 0) { return (CV_RTFUNC_FAIL); }

  cv_mem->cv_ttol = (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h)) *
                    cv_mem->cv_uround * HUNDRED;
  ier = cvRootfind(cv_mem);
  if (ier == CV_RTFUNC_FAIL) { return (CV_RTFUNC_FAIL); }
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i] && cv_mem->cv_grout[i] != ZERO)
    {
      cv_mem->cv_gactive[i] = SUNTRUE;
    }
  }
  cv_mem->cv_tlo = cv_mem->cv_trout;
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    cv_mem->cv_glo[i] = cv_mem->cv_grout[i];
  }

  /* If no root found, return CV_SUCCESS. */
  if (ier == CV_SUCCESS) { return (CV_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)CVodeGetDky(cv_mem, cv_mem->cv_trout, 0, cv_mem->cv_y);
  return (RTFOUND);
}